

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

void __thiscall PenguinV_Image::ImageTemplate<double>::clear(ImageTemplate<double> *this)

{
  ImageTemplate<double> *in_RDI;
  double *in_stack_ffffffffffffffe8;
  
  if (in_RDI->_data != (double *)0x0) {
    _deallocate(in_RDI,in_stack_ffffffffffffffe8);
    in_RDI->_data = (double *)0x0;
  }
  in_RDI->_width = 0;
  in_RDI->_height = 0;
  in_RDI->_rowSize = 0;
  return;
}

Assistant:

void clear()
        {
            if( _data != nullptr ) {
                _deallocate( _data );
                _data = nullptr;
            }

            _width   = 0;
            _height  = 0;
            _rowSize = 0;
        }